

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::Process(InterfaceVariableScalarReplacement *this)

{
  Module *pMVar1;
  Instruction *entry_point_00;
  Status SVar2;
  Status SVar3;
  Instruction *entry_point;
  Instruction **ppIVar4;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar4 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  SVar3 = SuccessWithoutChange;
  while( true ) {
    entry_point_00 = *ppIVar4;
    if (entry_point_00 ==
        (Instruction *)
        ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    break;
    SVar2 = ReplaceInterfaceVarsWithScalars(this,entry_point_00);
    if ((int)SVar2 < (int)SVar3) {
      SVar3 = SVar2;
    }
    ppIVar4 = &(entry_point_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return SVar3;
}

Assistant:

Pass::Status InterfaceVariableScalarReplacement::Process() {
  Pass::Status status = Status::SuccessWithoutChange;
  for (Instruction& entry_point : get_module()->entry_points()) {
    status =
        CombineStatus(status, ReplaceInterfaceVarsWithScalars(entry_point));
  }
  return status;
}